

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.h
# Opt level: O0

void __thiscall jrtplib::RTPSourceData::FlushPackets(RTPSourceData *this)

{
  RTPPacket *obj;
  bool bVar1;
  reference ppRVar2;
  RTPMemoryManager *mgr;
  iterator local_38;
  _List_const_iterator<jrtplib::RTPPacket_*> local_30;
  iterator local_28;
  _List_const_iterator<jrtplib::RTPPacket_*> local_20;
  _List_const_iterator<jrtplib::RTPPacket_*> local_18;
  const_iterator it;
  RTPSourceData *this_local;
  
  it._M_node = (_List_node_base *)this;
  std::_List_const_iterator<jrtplib::RTPPacket_*>::_List_const_iterator(&local_18);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::begin
                 (&this->packetlist);
  std::_List_const_iterator<jrtplib::RTPPacket_*>::_List_const_iterator(&local_20,&local_28);
  local_18._M_node = local_20._M_node;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::end
                   (&this->packetlist);
    std::_List_const_iterator<jrtplib::RTPPacket_*>::_List_const_iterator(&local_30,&local_38);
    bVar1 = std::operator!=(&local_18,&local_30);
    if (!bVar1) break;
    ppRVar2 = std::_List_const_iterator<jrtplib::RTPPacket_*>::operator*(&local_18);
    obj = *ppRVar2;
    mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDelete<jrtplib::RTPPacket>(obj,mgr);
    std::_List_const_iterator<jrtplib::RTPPacket_*>::operator++(&local_18);
  }
  std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::clear
            (&this->packetlist);
  return;
}

Assistant:

inline void RTPSourceData::FlushPackets()
{
	std::list<RTPPacket *>::const_iterator it;

	for (it = packetlist.begin() ; it != packetlist.end() ; ++it)
		RTPDelete(*it,GetMemoryManager());
	packetlist.clear();
}